

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_message.cc
# Opt level: O3

void __thiscall
absl::lts_20250127::log_internal::LogMessage::
CopyToEncodedBufferWithStructuredProtoField<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
          (LogMessage *this,StructuredProtoField field,string_view str)

{
  LogMessageData *pLVar1;
  ulong uVar2;
  size_type *psVar3;
  bool bVar4;
  unsigned_long uVar5;
  Span<char> *in_R8;
  LogMessageData *this_00;
  Span<char> msg;
  Span<const_char> value;
  Span<char> local_78;
  char *local_68;
  BufferSizeVisitor local_60;
  uint64_t local_58;
  _Variadic_union<std::variant<unsigned_long,_long,_unsigned_int,_int,_bool>,_std::variant<unsigned_long,_long,_double>,_absl::lts_20250127::Span<const_char>,_std::variant<unsigned_int,_int,_float>_>
  a_Stack_50 [2];
  
  local_68 = str._M_str;
  pLVar1 = (this->data_)._M_t.
           super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           ._M_t.
           super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           .
           super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
           ._M_head_impl;
  if ((pLVar1->encoded_remaining_actual_do_not_use_directly).ptr_ == (pointer)0x0) {
    (pLVar1->encoded_remaining_actual_do_not_use_directly).ptr_ = (pLVar1->encoded_buf)._M_elems;
    (pLVar1->encoded_remaining_actual_do_not_use_directly).len_ = 15000;
    LogMessageData::InitializeEncodingAndFormat(pLVar1);
  }
  local_78.ptr_ = (pLVar1->encoded_remaining_actual_do_not_use_directly).ptr_;
  local_78.len_ = (pLVar1->encoded_remaining_actual_do_not_use_directly).len_;
  a_Stack_50[0]._8_8_ =
       field.value.
       super__Variant_base<std::variant<unsigned_long,_long,_unsigned_int,_int,_bool>,_std::variant<unsigned_long,_long,_double>,_absl::lts_20250127::Span<const_char>,_std::variant<unsigned_int,_int,_float>_>
       .
       super__Move_assign_alias<std::variant<unsigned_long,_long,_unsigned_int,_int,_bool>,_std::variant<unsigned_long,_long,_double>,_absl::lts_20250127::Span<const_char>,_std::variant<unsigned_int,_int,_float>_>
       .
       super__Copy_assign_alias<std::variant<unsigned_long,_long,_unsigned_int,_int,_bool>,_std::variant<unsigned_long,_long,_double>,_absl::lts_20250127::Span<const_char>,_std::variant<unsigned_int,_int,_float>_>
       .
       super__Move_ctor_alias<std::variant<unsigned_long,_long,_unsigned_int,_int,_bool>,_std::variant<unsigned_long,_long,_double>,_absl::lts_20250127::Span<const_char>,_std::variant<unsigned_int,_int,_float>_>
       .
       super__Copy_ctor_alias<std::variant<unsigned_long,_long,_unsigned_int,_int,_bool>,_std::variant<unsigned_long,_long,_double>,_absl::lts_20250127::Span<const_char>,_std::variant<unsigned_int,_int,_float>_>
       .
       super__Variant_storage_alias<std::variant<unsigned_long,_long,_unsigned_int,_int,_bool>,_std::variant<unsigned_long,_long,_double>,_absl::lts_20250127::Span<const_char>,_std::variant<unsigned_int,_int,_float>_>
       ._M_u._8_8_;
  a_Stack_50[1]._0_8_ =
       field.value.
       super__Variant_base<std::variant<unsigned_long,_long,_unsigned_int,_int,_bool>,_std::variant<unsigned_long,_long,_double>,_absl::lts_20250127::Span<const_char>,_std::variant<unsigned_int,_int,_float>_>
       .
       super__Move_assign_alias<std::variant<unsigned_long,_long,_unsigned_int,_int,_bool>,_std::variant<unsigned_long,_long,_double>,_absl::lts_20250127::Span<const_char>,_std::variant<unsigned_int,_int,_float>_>
       .
       super__Copy_assign_alias<std::variant<unsigned_long,_long,_unsigned_int,_int,_bool>,_std::variant<unsigned_long,_long,_double>,_absl::lts_20250127::Span<const_char>,_std::variant<unsigned_int,_int,_float>_>
       .
       super__Move_ctor_alias<std::variant<unsigned_long,_long,_unsigned_int,_int,_bool>,_std::variant<unsigned_long,_long,_double>,_absl::lts_20250127::Span<const_char>,_std::variant<unsigned_int,_int,_float>_>
       .
       super__Copy_ctor_alias<std::variant<unsigned_long,_long,_unsigned_int,_int,_bool>,_std::variant<unsigned_long,_long,_double>,_absl::lts_20250127::Span<const_char>,_std::variant<unsigned_int,_int,_float>_>
       .
       super__Variant_storage_alias<std::variant<unsigned_long,_long,_unsigned_int,_int,_bool>,_std::variant<unsigned_long,_long,_double>,_absl::lts_20250127::Span<const_char>,_std::variant<unsigned_int,_int,_float>_>
       ._16_8_;
  local_58 = field.field_number;
  a_Stack_50[0]._M_first._M_storage.
  super__Variant_base<unsigned_long,_long,_unsigned_int,_int,_bool>.
  super__Move_assign_alias<unsigned_long,_long,_unsigned_int,_int,_bool>.
  super__Copy_assign_alias<unsigned_long,_long,_unsigned_int,_int,_bool>.
  super__Move_ctor_alias<unsigned_long,_long,_unsigned_int,_int,_bool>.
  super__Copy_ctor_alias<unsigned_long,_long,_unsigned_int,_int,_bool>.
  super__Variant_storage_alias<unsigned_long,_long,_unsigned_int,_int,_bool>._M_u =
       field.value.
       super__Variant_base<std::variant<unsigned_long,_long,_unsigned_int,_int,_bool>,_std::variant<unsigned_long,_long,_double>,_absl::lts_20250127::Span<const_char>,_std::variant<unsigned_int,_int,_float>_>
       .
       super__Move_assign_alias<std::variant<unsigned_long,_long,_unsigned_int,_int,_bool>,_std::variant<unsigned_long,_long,_double>,_absl::lts_20250127::Span<const_char>,_std::variant<unsigned_int,_int,_float>_>
       .
       super__Copy_assign_alias<std::variant<unsigned_long,_long,_unsigned_int,_int,_bool>,_std::variant<unsigned_long,_long,_double>,_absl::lts_20250127::Span<const_char>,_std::variant<unsigned_int,_int,_float>_>
       .
       super__Move_ctor_alias<std::variant<unsigned_long,_long,_unsigned_int,_int,_bool>,_std::variant<unsigned_long,_long,_double>,_absl::lts_20250127::Span<const_char>,_std::variant<unsigned_int,_int,_float>_>
       .
       super__Copy_ctor_alias<std::variant<unsigned_long,_long,_unsigned_int,_int,_bool>,_std::variant<unsigned_long,_long,_double>,_absl::lts_20250127::Span<const_char>,_std::variant<unsigned_int,_int,_float>_>
       .
       super__Variant_storage_alias<std::variant<unsigned_long,_long,_unsigned_int,_int,_bool>,_std::variant<unsigned_long,_long,_double>,_absl::lts_20250127::Span<const_char>,_std::variant<unsigned_int,_int,_float>_>
       ._M_u._M_first._M_storage.super__Variant_base<unsigned_long,_long,_unsigned_int,_int,_bool>.
       super__Move_assign_alias<unsigned_long,_long,_unsigned_int,_int,_bool>.
       super__Copy_assign_alias<unsigned_long,_long,_unsigned_int,_int,_bool>.
       super__Move_ctor_alias<unsigned_long,_long,_unsigned_int,_int,_bool>.
       super__Copy_ctor_alias<unsigned_long,_long,_unsigned_int,_int,_bool>.
       super__Variant_storage_alias<unsigned_long,_long,_unsigned_int,_int,_bool>._M_u;
  local_60.field_number = field.field_number;
  uVar5 = (*std::__detail::__variant::
            __gen_vtable<std::__detail::__variant::__deduce_visit_result<unsigned_long>,_BufferSizeVisitor_&&,_std::variant<std::variant<unsigned_long,_long,_unsigned_int,_int,_bool>,_std::variant<unsigned_long,_long,_double>,_absl::lts_20250127::Span<const_char>,_std::variant<unsigned_int,_int,_float>_>_&>
            ::_S_vtable._M_arr
            [field.value.
             super__Variant_base<std::variant<unsigned_long,_long,_unsigned_int,_int,_bool>,_std::variant<unsigned_long,_long,_double>,_absl::lts_20250127::Span<const_char>,_std::variant<unsigned_int,_int,_float>_>
             .
             super__Move_assign_alias<std::variant<unsigned_long,_long,_unsigned_int,_int,_bool>,_std::variant<unsigned_long,_long,_double>,_absl::lts_20250127::Span<const_char>,_std::variant<unsigned_int,_int,_float>_>
             .
             super__Copy_assign_alias<std::variant<unsigned_long,_long,_unsigned_int,_int,_bool>,_std::variant<unsigned_long,_long,_double>,_absl::lts_20250127::Span<const_char>,_std::variant<unsigned_int,_int,_float>_>
             .
             super__Move_ctor_alias<std::variant<unsigned_long,_long,_unsigned_int,_int,_bool>,_std::variant<unsigned_long,_long,_double>,_absl::lts_20250127::Span<const_char>,_std::variant<unsigned_int,_int,_float>_>
             .
             super__Copy_ctor_alias<std::variant<unsigned_long,_long,_unsigned_int,_int,_bool>,_std::variant<unsigned_long,_long,_double>,_absl::lts_20250127::Span<const_char>,_std::variant<unsigned_int,_int,_float>_>
             .
             super__Variant_storage_alias<std::variant<unsigned_long,_long,_unsigned_int,_int,_bool>,_std::variant<unsigned_long,_long,_double>,_absl::lts_20250127::Span<const_char>,_std::variant<unsigned_int,_int,_float>_>
             ._16_8_ & 0xff]._M_data)
                    (&local_60,
                     (variant<std::variant<unsigned_long,_long,_unsigned_int,_int,_bool>,_std::variant<unsigned_long,_long,_double>,_absl::lts_20250127::Span<const_char>,_std::variant<unsigned_int,_int,_float>_>
                      *)&a_Stack_50[0]._M_first);
  msg = EncodeMessageStart(7,(uint64_t)((pointer)str._M_len + uVar5 + 0xb),&local_78);
  bVar4 = EncodeStructuredProtoField(field,&local_78);
  if ((bVar4) &&
     (value.len_ = (size_type)&local_78, value.ptr_ = (pointer)str._M_len,
     bVar4 = EncodeBytesTruncate((log_internal *)0x1,(uint64_t)local_68,value,in_R8), bVar4)) {
    EncodeMessageLength(msg,&local_78);
    pLVar1 = (this->data_)._M_t.
             super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
             ._M_t.
             super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
             .
             super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
             ._M_head_impl;
    if ((pLVar1->encoded_remaining_actual_do_not_use_directly).ptr_ == (pointer)0x0) {
      (pLVar1->encoded_remaining_actual_do_not_use_directly).ptr_ = (pLVar1->encoded_buf)._M_elems;
      (pLVar1->encoded_remaining_actual_do_not_use_directly).len_ = 15000;
      LogMessageData::InitializeEncodingAndFormat(pLVar1);
    }
    (pLVar1->encoded_remaining_actual_do_not_use_directly).ptr_ = local_78.ptr_;
    (pLVar1->encoded_remaining_actual_do_not_use_directly).len_ = local_78.len_;
    return;
  }
  pLVar1 = (this->data_)._M_t.
           super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           ._M_t.
           super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           .
           super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
           ._M_head_impl;
  this_00 = pLVar1;
  if ((pLVar1->encoded_remaining_actual_do_not_use_directly).ptr_ == (pointer)0x0) {
    (pLVar1->encoded_remaining_actual_do_not_use_directly).ptr_ = (pLVar1->encoded_buf)._M_elems;
    (pLVar1->encoded_remaining_actual_do_not_use_directly).len_ = 15000;
    LogMessageData::InitializeEncodingAndFormat(pLVar1);
    this_00 = (this->data_)._M_t.
              super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
              ._M_t.
              super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
              .
              super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
              ._M_head_impl;
    if ((this_00->encoded_remaining_actual_do_not_use_directly).ptr_ == (pointer)0x0) {
      (this_00->encoded_remaining_actual_do_not_use_directly).ptr_ = (this_00->encoded_buf)._M_elems
      ;
      (this_00->encoded_remaining_actual_do_not_use_directly).len_ = 15000;
      LogMessageData::InitializeEncodingAndFormat(this_00);
    }
  }
  uVar2 = (pLVar1->encoded_remaining_actual_do_not_use_directly).len_;
  psVar3 = &(this_00->encoded_remaining_actual_do_not_use_directly).len_;
  if (*psVar3 <= uVar2) {
    (pLVar1->encoded_remaining_actual_do_not_use_directly).len_ = uVar2 - *psVar3;
    return;
  }
  __assert_fail("false && \"size() >= n\"",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/types/span.h"
                ,0x1b5,
                "auto absl::Span<char>::remove_suffix(size_type)::(anonymous class)::operator()() const [T = char]"
               );
}

Assistant:

void LogMessage::CopyToEncodedBufferWithStructuredProtoField(
    StructuredProtoField field, absl::string_view str) {
  auto encoded_remaining_copy = data_->encoded_remaining();
  size_t encoded_field_size = BufferSizeForStructuredProtoField(field);
  constexpr uint8_t tag_value = str_type == StringType::kLiteral
                                    ? ValueTag::kStringLiteral
                                    : ValueTag::kString;
  auto start = EncodeMessageStart(
      EventTag::kValue,
      encoded_field_size +
          BufferSizeFor(tag_value, WireType::kLengthDelimited) + str.size(),
      &encoded_remaining_copy);

  // Write the encoded proto field.
  if (!EncodeStructuredProtoField(field, encoded_remaining_copy)) {
    // The header / field will not fit; zero `encoded_remaining()` so we
    // don't write anything else later.
    data_->encoded_remaining().remove_suffix(data_->encoded_remaining().size());
    return;
  }

  // Write the string, truncating if necessary.
  if (!EncodeStringTruncate(ValueTag::kString, str, &encoded_remaining_copy)) {
    // The length of the string itself did not fit; zero `encoded_remaining()`
    // so the value is not encoded at all.
    data_->encoded_remaining().remove_suffix(data_->encoded_remaining().size());
    return;
  }

  EncodeMessageLength(start, &encoded_remaining_copy);
  data_->encoded_remaining() = encoded_remaining_copy;
}